

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool validate_integral_image
               (_func_void_float_ptr_integral_image_ptr *original_function,
               vector<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
               *test_functions,int width,int height,float *image,bool is_padded)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  float *pfVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  integral_image *__ptr;
  integral_image *__ptr_00;
  ulong uVar9;
  bool bVar10;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  undefined7 in_register_00000089;
  float *pfVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  undefined1 auVar18 [64];
  
  if ((int)CONCAT71(in_register_00000089,is_padded) == 0) {
    __ptr = create_integral_img(width,height);
  }
  else {
    __ptr = create_padded_integral_img(width,height);
  }
  (*original_function)(image,__ptr);
  if ((test_functions->
      super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (test_functions->
      super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    bVar10 = true;
  }
  else {
    bVar10 = true;
    uVar12 = 0;
    do {
      if (is_padded) {
        __ptr_00 = create_padded_integral_img(width,height);
      }
      else {
        __ptr_00 = create_integral_img(width,height);
      }
      (*(test_functions->
        super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar12])(image,__ptr_00);
      uVar9 = (ulong)__ptr->data_height;
      bVar17 = (long)uVar9 < 1;
      auVar18 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      if (0 < (long)uVar9) {
        pfVar6 = __ptr->padded_data;
        pfVar7 = __ptr_00->padded_data;
        uVar5 = __ptr->data_width;
        lVar13 = (long)(int)uVar5;
        pfVar14 = pfVar7 + 1;
        pfVar11 = pfVar6 + 1;
        uVar16 = 0;
        bVar17 = false;
        do {
          if (0 < (int)uVar5) {
            fVar3 = pfVar6[uVar16 * lVar13];
            fVar4 = pfVar7[uVar16 * lVar13];
            auVar8 = vandps_avx(ZEXT416((uint)(fVar3 - fVar4)),auVar18._0_16_);
            if (1e-06 < auVar8._0_4_) {
              printf("DIFFERENCE: (%i, %i) original: %f, optimized: %f\n",(double)fVar3,
                     (double)fVar4,uVar16 & 0xffffffff,0);
              break;
            }
            uVar15 = 0;
            do {
              if ((ulong)uVar5 - 1 == uVar15) goto LAB_00199fc2;
              pfVar1 = pfVar11 + uVar15;
              pfVar2 = pfVar14 + uVar15;
              auVar8 = vandps_avx(ZEXT416((uint)(*pfVar1 - *pfVar2)),auVar18._0_16_);
              uVar15 = uVar15 + 1;
            } while (auVar8._0_4_ <= 1e-06);
            printf("DIFFERENCE: (%i, %i) original: %f, optimized: %f\n",(double)*pfVar1,
                   (double)*pfVar2,uVar16 & 0xffffffff,uVar15 & 0xffffffff);
            auVar18 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            if ((long)uVar15 < lVar13) break;
          }
LAB_00199fc2:
          uVar16 = uVar16 + 1;
          pfVar14 = pfVar14 + lVar13;
          pfVar11 = pfVar11 + lVar13;
          bVar17 = uVar9 <= uVar16;
        } while (uVar16 != uVar9);
      }
      if (!bVar17) {
        bVar10 = false;
        printf("Error: compute_integral_img() test function %d does not match original function.\n",
               uVar12 & 0xffffffff);
      }
      free(__ptr_00->padded_data);
      free(__ptr_00);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)(test_functions->
                                    super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(test_functions->
                                    super__Vector_base<void_(*)(float_*,_integral_image_*),_std::allocator<void_(*)(float_*,_integral_image_*)>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  free(__ptr->padded_data);
  free(__ptr);
  return bVar10;
}

Assistant:

bool validate_integral_image(void (*original_function)(float *, struct integral_image *),
                             const std::vector<void (*)(float *, struct integral_image *)> &test_functions, int width,
                             int height, float *image, bool is_padded) {

    // Checking if original integral image should be padded and initializing it   
    struct integral_image *original_iimage;
    if (!is_padded) {
        original_iimage = create_integral_img(width, height);
    } else {
        original_iimage = create_padded_integral_img(width, height);
    }

    // Compute original integral image
    original_function(image, original_iimage);
    
    bool all_functions_equal = true;

    // Iterating through all test functions
    for (int j = 0; j < test_functions.size(); ++j) {
        
        // Checking if optimized integral image should be padded and initializing it   
        struct integral_image *optimized_iimage;
        if (!is_padded) {
            optimized_iimage = create_integral_img(width, height);
        } else {
            optimized_iimage = create_padded_integral_img(width, height);
        }
        
        // Compute optimized integral image of optimized test function j 
        test_functions[j](image, optimized_iimage);

        if (!are_float_matrices_equal(original_iimage->padded_data, 
                                      optimized_iimage->padded_data, 
                                      original_iimage->data_width, 
                                      original_iimage->data_height)) {
            all_functions_equal = false;
            printf("Error: compute_integral_img() test function %d does not match original function.\n", j);
        }

        free(optimized_iimage->padded_data);
        free(optimized_iimage);
    }

    free(original_iimage->padded_data);
    free(original_iimage);

    return all_functions_equal;

}